

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

UBool icu_63::operator==(StringPiece *x,StringPiece *y)

{
  int iVar1;
  long lVar2;
  
  iVar1 = x->length_;
  lVar2 = (long)iVar1;
  if (iVar1 == y->length_) {
    if (iVar1 == 0) {
      return '\x01';
    }
    if (x->ptr_[lVar2 + -1] == y->ptr_[lVar2 + -1]) {
      iVar1 = bcmp(x->ptr_,y->ptr_,lVar2 - 1);
      return iVar1 == 0;
    }
  }
  return '\0';
}

Assistant:

int32_t size() const { return length_; }